

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void __thiscall
duckdb::BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t>::CalculateDeltaStats
          (BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t> *this)

{
  int64_t iVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  hugeint_t *phVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  hugeint_t hVar11;
  hugeint_t local_58;
  uhugeint_t local_48;
  
  local_58.upper = 0x7fffffffffffffff;
  local_58.lower = 0xffffffffffffffff;
  local_48 = hugeint_t::operator_cast_to_uhugeint_t(&local_58);
  bVar2 = uhugeint_t::operator>(&this->maximum,&local_48);
  if (bVar2) {
    return;
  }
  if (this->compression_buffer_idx < 2) {
    return;
  }
  if (this->all_valid != true) {
    return;
  }
  if ((long)this->compression_buffer_idx < 1) {
    this->can_do_delta = true;
LAB_005a64dd:
    phVar6 = this->delta_buffer;
    uVar3 = 1;
    do {
      phVar6 = phVar6 + 1;
      local_48.lower = (this->maximum_delta).lower;
      local_48.upper = (this->maximum_delta).upper;
      local_58 = *phVar6;
      bVar2 = hugeint_t::operator>((hugeint_t *)&local_48,&local_58);
      uVar10 = (uint)bVar2;
      uVar7 = (int)(uVar10 << 0x1f) >> 0x1f;
      uVar8 = (int)(uVar10 << 0x1f) >> 0x1f;
      uVar9 = (int)(uVar10 << 0x1f) >> 0x1f;
      uVar10 = (int)(uVar10 << 0x1f) >> 0x1f;
      *(uint *)&(this->maximum_delta).lower =
           uVar7 & (uint)local_48.lower | ~uVar7 & (uint)local_58.lower;
      *(uint *)((long)&(this->maximum_delta).lower + 4) =
           uVar8 & local_48.lower._4_4_ | ~uVar8 & local_58.lower._4_4_;
      *(uint *)&(this->maximum_delta).upper =
           uVar9 & (uint)local_48.upper | ~uVar9 & (uint)local_58.upper;
      *(uint *)((long)&(this->maximum_delta).upper + 4) =
           uVar10 & local_48.upper._4_4_ | ~uVar10 & local_58.upper._4_4_;
      local_48.lower = (this->minimum_delta).lower;
      local_48.upper = (this->minimum_delta).upper;
      local_58 = *phVar6;
      bVar2 = hugeint_t::operator<((hugeint_t *)&local_48,&local_58);
      uVar10 = (uint)bVar2;
      uVar7 = (int)(uVar10 << 0x1f) >> 0x1f;
      uVar8 = (int)(uVar10 << 0x1f) >> 0x1f;
      uVar9 = (int)(uVar10 << 0x1f) >> 0x1f;
      uVar10 = (int)(uVar10 << 0x1f) >> 0x1f;
      *(uint *)&(this->minimum_delta).lower =
           uVar7 & (uint)local_48.lower | ~uVar7 & (uint)local_58.lower;
      *(uint *)((long)&(this->minimum_delta).lower + 4) =
           uVar8 & local_48.lower._4_4_ | ~uVar8 & local_58.lower._4_4_;
      *(uint *)&(this->minimum_delta).upper =
           uVar9 & (uint)local_48.upper | ~uVar9 & (uint)local_58.upper;
      *(uint *)((long)&(this->minimum_delta).upper + 4) =
           uVar10 & local_48.upper._4_4_ | ~uVar10 & local_58.upper._4_4_;
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->compression_buffer_idx);
    iVar1 = (this->minimum_delta).upper;
    this->delta_buffer[0].lower = (this->minimum_delta).lower;
    this->delta_buffer[0].upper = iVar1;
    if ((this->can_do_delta & 1U) != 0) goto LAB_005a65be;
    this->can_do_delta = false;
  }
  else {
    lVar4 = 0;
    lVar5 = 0;
    do {
      local_48 = (uhugeint_t)
                 uhugeint_t::operator_cast_to_hugeint_t
                           ((uhugeint_t *)((long)&this->compression_buffer->lower + lVar4));
      local_58 = uhugeint_t::operator_cast_to_hugeint_t
                           ((uhugeint_t *)((long)&this->compression_buffer[-1].lower + lVar4));
      hVar11 = hugeint_t::operator-((hugeint_t *)&local_48,&local_58);
      *(uint64_t *)((long)&this->delta_buffer[0].lower + lVar4) = hVar11.lower;
      *(int64_t *)((long)&this->delta_buffer[0].upper + lVar4) = hVar11.upper;
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar5 < (long)this->compression_buffer_idx);
    this->can_do_delta = true;
    if (1 < this->compression_buffer_idx) goto LAB_005a64dd;
    iVar1 = (this->minimum_delta).upper;
    this->delta_buffer[0].lower = (this->minimum_delta).lower;
    this->delta_buffer[0].upper = iVar1;
LAB_005a65be:
    bVar2 = TrySubtractOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                      (this->maximum_delta,this->minimum_delta,&this->min_max_delta_diff);
    this->can_do_delta = bVar2;
    if (bVar2) {
      hVar11 = uhugeint_t::operator_cast_to_hugeint_t(this->compression_buffer);
      bVar2 = TrySubtractOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                        (hVar11,this->minimum_delta,&this->delta_offset);
      goto LAB_005a662b;
    }
  }
  bVar2 = false;
LAB_005a662b:
  this->can_do_delta = bVar2;
  return;
}

Assistant:

void CalculateDeltaStats() {
		// TODO: currently we dont support delta compression of values above NumericLimits<T_S>::Maximum(),
		// 		 we could support this with some clever substract trickery?
		if (maximum > static_cast<T>(NumericLimits<T_S>::Maximum())) {
			return;
		}

		// Don't delta encoding 1 value makes no sense
		if (compression_buffer_idx < 2) {
			return;
		}

		// TODO: handle NULLS here?
		// Currently we cannot handle nulls because we would need an additional step of patching for this.
		// we could for example copy the last value on a null insert. This would help a bit, but not be optimal for
		// large deltas since theres suddenly a zero then. Ideally we would insert a value that leads to a delta within
		// the current domain of deltas however we dont know that domain here yet
		if (!all_valid) {
			return;
		}

		// Note: since we dont allow any values over NumericLimits<T_S>::Maximum(), all subtractions for unsigned types
		// are guaranteed not to overflow
		bool can_do_all = true;
		if (NumericLimits<T>::IsSigned()) {
			T_S bogus;
			can_do_all = TrySubtractOperator::Operation(static_cast<T_S>(minimum), static_cast<T_S>(maximum), bogus) &&
			             TrySubtractOperator::Operation(static_cast<T_S>(maximum), static_cast<T_S>(minimum), bogus);
		}

		// Calculate delta's
		// compression_buffer pointer points one element ahead of the internal buffer making the use of signed index
		// integer (-1) possible
		D_ASSERT(compression_buffer_idx <= NumericLimits<int64_t>::Maximum());
		if (can_do_all) {
			for (int64_t i = 0; i < static_cast<int64_t>(compression_buffer_idx); i++) {
				delta_buffer[i] = static_cast<T_S>(compression_buffer[i]) - static_cast<T_S>(compression_buffer[i - 1]);
			}
		} else {
			for (int64_t i = 0; i < static_cast<int64_t>(compression_buffer_idx); i++) {
				auto success =
				    TrySubtractOperator::Operation(static_cast<T_S>(compression_buffer[i]),
				                                   static_cast<T_S>(compression_buffer[i - 1]), delta_buffer[i]);
				if (!success) {
					return;
				}
			}
		}

		can_do_delta = true;

		for (idx_t i = 1; i < compression_buffer_idx; i++) {
			maximum_delta = MaxValue<T_S>(maximum_delta, delta_buffer[i]);
			minimum_delta = MinValue<T_S>(minimum_delta, delta_buffer[i]);
		}

		// Since we can set the first value arbitrarily, we want to pick one from the current domain, note that
		// we will store the original first value - this offset as the  delta_offset to be able to decode this again.
		delta_buffer[0] = minimum_delta;

		can_do_delta = can_do_delta && TrySubtractOperator::Operation(maximum_delta, minimum_delta, min_max_delta_diff);
		can_do_delta = can_do_delta && TrySubtractOperator::Operation(static_cast<T_S>(compression_buffer[0]),
		                                                              minimum_delta, delta_offset);
	}